

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

Regexp * re2::Regexp::Parse(StringPiece *s,ParseFlags global_flags,RegexpStatus *status)

{
  byte bVar1;
  ParseFlags PVar2;
  int iVar3;
  ParseStatus PVar4;
  string *utf;
  Regexp *pRVar5;
  CharClassBuilder *pCVar6;
  size_type sVar7;
  UGroup *g;
  Regexp *pRVar8;
  uint8_t *puVar9;
  RegexpStatus *this;
  RegexpOp RVar10;
  size_type sVar11;
  size_type sVar12;
  bool bVar13;
  Rune r;
  int hi;
  ParseState ps;
  int lo;
  RegexpStatus xstatus;
  StringPiece local_d8;
  StringPiece local_c8;
  int local_ac;
  ParseState local_a8;
  int local_74;
  RegexpStatus *local_70;
  StringPiece local_68;
  RegexpStatus local_50;
  
  local_70 = &local_50;
  this = status;
  if (status == (RegexpStatus *)0x0) {
    this = local_70;
  }
  bVar13 = (global_flags & Latin1) == NoParseFlags;
  local_a8.rune_max_ = 0xff;
  if (bVar13) {
    local_a8.rune_max_ = 0x10ffff;
  }
  local_50.code_ = kRegexpSuccess;
  local_50.error_arg_.data_ = (const_pointer)0x0;
  local_50.error_arg_.size_ = 0;
  local_50.tmp_ = (string *)0x0;
  local_a8.whole_regexp_.data_ = s->data_;
  local_a8.whole_regexp_.size_ = s->size_;
  local_a8.stacktop_ = (Regexp *)0x0;
  local_a8.ncap_ = 0;
  local_d8.data_ = s->data_;
  local_d8.size_ = s->size_;
  local_a8.flags_ = global_flags;
  local_a8.status_ = this;
  if (!bVar13) {
    utf = (string *)operator_new(0x20);
    (utf->_M_dataplus)._M_p = (pointer)&utf->field_2;
    utf->_M_string_length = 0;
    (utf->field_2)._M_local_buf[0] = '\0';
    ConvertLatin1ToUTF8(&local_d8,utf);
    RegexpStatus::set_tmp(this,utf);
    local_d8.data_ = (utf->_M_dataplus)._M_p;
    local_d8.size_ = utf->_M_string_length;
  }
  if ((global_flags & Literal) == NoParseFlags) {
    if (status != (RegexpStatus *)0x0) {
      local_70 = status;
    }
    sVar12 = 0;
    pRVar8 = (Regexp *)0x0;
    do {
      PVar2 = local_a8.flags_;
      pRVar5 = (Regexp *)local_d8.data_;
      if (local_d8.size_ == 0) {
        pRVar8 = ParseState::DoFinish(&local_a8);
        goto LAB_002399c6;
      }
      bVar1 = *(uint8_t *)local_d8.data_;
      if (0x3e < bVar1) {
        if (0x5d < bVar1) {
          if (bVar1 == 0x5e) {
            ParseState::PushCaret(&local_a8);
            goto LAB_002398d1;
          }
          if (bVar1 != 0x7b) {
            if (bVar1 != 0x7c) goto switchD_002392eb_caseD_25;
            ParseState::DoVerticalBar(&local_a8);
            goto LAB_002398d1;
          }
          local_68.data_ = local_d8.data_;
          local_68.size_ = local_d8.size_;
          local_c8.data_ = local_d8.data_;
          local_c8.size_ = local_d8.size_;
          if ((local_d8.size_ == 0) || (*(uint8_t *)local_d8.data_ != '{')) {
LAB_002398c2:
            ParseState::PushLiteral(&local_a8,0x7b);
            goto LAB_002398d1;
          }
          local_c8.data_ = (const_pointer)((long)local_d8.data_ + 1);
          local_c8.size_ = local_d8.size_ - 1;
          bVar13 = ParseInteger(&local_c8,&local_74);
          if ((!bVar13) || (local_c8.size_ == 0)) goto LAB_002398c2;
          if (*(uint8_t *)local_c8.data_ == ',') {
            local_c8.data_ = (const_pointer)((long)local_c8.data_ + 1);
            local_c8.size_ = local_c8.size_ - 1;
            if (local_c8.size_ == 0) goto LAB_002398c2;
            if (*local_c8.data_ == '}') {
              local_ac = -1;
            }
            else {
              bVar13 = ParseInteger(&local_c8,&local_ac);
              if (!bVar13) goto LAB_002398c2;
            }
          }
          else {
            local_ac = local_74;
          }
          pRVar5 = (Regexp *)local_68.data_;
          if ((local_c8.size_ == 0) || (*(uint8_t *)local_c8.data_ != '}')) goto LAB_002398c2;
          puVar9 = (uint8_t *)((long)local_c8.data_ + 1);
          sVar7 = local_c8.size_ - 1;
          local_d8.data_ = (const_pointer)puVar9;
          local_d8.size_ = sVar7;
          if ((local_a8.flags_ & PerlX) == NoParseFlags) {
            bVar13 = false;
LAB_0023993d:
            sVar11 = (long)local_d8.data_ - (long)local_68.data_;
            local_c8.data_ = (const_pointer)puVar9;
            local_c8.size_ = sVar7;
            local_68.size_ = sVar11;
            bVar13 = ParseState::PushRepetition(&local_a8,local_74,local_ac,&local_68,bVar13);
            goto LAB_00239494;
          }
          if ((sVar7 == 0) || (*puVar9 != '?')) {
            bVar13 = false;
          }
          else {
            bVar13 = true;
            local_d8.data_ = (const_pointer)((long)local_c8.data_ + 2);
            local_d8.size_ = local_c8.size_ - 2;
          }
          local_c8.data_ = (const_pointer)puVar9;
          local_c8.size_ = sVar7;
          if (sVar12 == 0) goto LAB_0023993d;
          goto LAB_00239452;
        }
        if (bVar1 == 0x3f) {
          RVar10 = kRegexpQuest;
          goto LAB_00239407;
        }
        if (bVar1 == 0x5b) {
          bVar13 = ParseState::ParseCharClass(&local_a8,&local_d8,(Regexp **)&local_c8,this);
          if (bVar13) {
            ParseState::PushRegexp(&local_a8,(Regexp *)local_c8.data_);
LAB_002394de:
            iVar3 = 1;
            if (bVar13 != false) goto LAB_002398da;
            goto LAB_002398eb;
          }
        }
        else {
          if (bVar1 != 0x5c) goto switchD_002392eb_caseD_25;
          if (local_d8.size_ != 1 && (local_a8.flags_ >> 8 & 1) != 0) {
            if (*(uint8_t *)((long)local_d8.data_ + 1) == 'b') {
              RVar10 = kRegexpWordBoundary;
            }
            else {
              if (*(uint8_t *)((long)local_d8.data_ + 1) != 'B') goto LAB_002395db;
              RVar10 = kRegexpNoWordBoundary;
            }
            ParseState::PushSimpleOp(&local_a8,RVar10);
            goto LAB_00239635;
          }
LAB_002395db:
          if (local_d8.size_ != 1 && (local_a8.flags_ >> 9 & 1) != 0) {
            bVar1 = *(uint8_t *)((long)local_d8.data_ + 1);
            if (bVar1 < 0x51) {
              if (bVar1 == 0x41) {
                ParseState::PushSimpleOp(&local_a8,kRegexpBeginText);
              }
              else {
                if (bVar1 != 0x43) goto LAB_00239664;
                ParseState::PushSimpleOp(&local_a8,kRegexpAnyByte);
              }
LAB_00239635:
              local_d8.data_ = (const_pointer)((long)local_d8.data_ + 2);
              local_d8.size_ = local_d8.size_ - 2;
              goto LAB_002398da;
            }
            if (bVar1 == 0x51) {
              local_d8.data_ = (const_pointer)((long)local_d8.data_ + 2);
              local_d8.size_ = local_d8.size_ - 2;
              while( true ) {
                if (local_d8.size_ != 1) {
                  sVar11 = local_d8.size_;
                  if (local_d8.size_ == 0) goto LAB_002398dd;
                  if ((*(uint8_t *)local_d8.data_ == '\\') &&
                     (*(uint8_t *)((long)local_d8.data_ + 1) == 'E')) {
                    local_d8.data_ = (const_pointer)((long)local_d8.data_ + 2);
                    local_d8.size_ = local_d8.size_ - 2;
                    goto LAB_002398da;
                  }
                }
                iVar3 = StringPieceToRune((Rune *)&local_c8,&local_d8,this);
                if (iVar3 < 0) break;
                ParseState::PushLiteral(&local_a8,(Rune)local_c8.data_);
              }
              goto LAB_00239767;
            }
            if (bVar1 == 0x7a) {
              ParseState::PushSimpleOp(&local_a8,kRegexpEndText);
              goto LAB_00239635;
            }
          }
LAB_00239664:
          if ((local_d8.size_ != 1) && ((*(uint8_t *)((long)local_d8.data_ + 1) | 0x20) == 0x70)) {
            pRVar5 = (Regexp *)operator_new(0x28);
            Regexp(pRVar5,kRegexpCharClass,
                   PVar2 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|
                            NonGreedy|Latin1|OneLine|MatchNL|Literal));
            pCVar6 = (CharClassBuilder *)operator_new(0x40);
            CharClassBuilder::CharClassBuilder(pCVar6);
            (pRVar5->field_7).field_3.ccb_ = pCVar6;
            PVar4 = ParseUnicodeGroup(&local_d8,PVar2,pCVar6,this);
            if (PVar4 == kParseOk) {
              iVar3 = 0xb;
              ParseState::PushRegexp(&local_a8,pRVar5);
            }
            else if (PVar4 == kParseError) {
              iVar3 = 1;
              Decref(pRVar5);
            }
            else {
              iVar3 = 0;
              if (PVar4 == kParseNothing) {
                Decref(pRVar5);
              }
            }
            if (iVar3 == 0xb) goto LAB_002398da;
            if (iVar3 != 0) goto LAB_002398eb;
          }
          PVar2 = local_a8.flags_;
          g = MaybeParsePerlCCEscape(&local_d8,local_a8.flags_);
          if (g != (UGroup *)0x0) {
            pRVar8 = (Regexp *)operator_new(0x28);
            Regexp(pRVar8,kRegexpCharClass,
                   PVar2 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|
                            NonGreedy|Latin1|OneLine|MatchNL|Literal));
            pCVar6 = (CharClassBuilder *)operator_new(0x40);
            CharClassBuilder::CharClassBuilder(pCVar6);
            (pRVar8->field_7).field_3.ccb_ = pCVar6;
            AddUGroup(pCVar6,g,g->sign,PVar2);
            ParseState::PushRegexp(&local_a8,pRVar8);
            goto LAB_002398da;
          }
          bVar13 = ParseEscape(&local_d8,(Rune *)&local_c8,this,local_a8.rune_max_);
          if (bVar13) {
            ParseState::PushLiteral(&local_a8,(Rune)local_c8.data_);
            goto LAB_002394de;
          }
        }
        goto LAB_002398a3;
      }
      switch(bVar1) {
      case 0x24:
        ParseState::PushDollar(&local_a8);
        break;
      default:
switchD_002392eb_caseD_25:
        iVar3 = StringPieceToRune((Rune *)&local_c8,&local_d8,this);
        if (-1 < iVar3) {
          ParseState::PushLiteral(&local_a8,(Rune)local_c8.data_);
          goto LAB_002398da;
        }
LAB_00239767:
        iVar3 = 1;
        goto LAB_002398eb;
      case 0x28:
        if ((local_d8.size_ != 1 && (local_a8.flags_ >> 9 & 1) != 0) &&
           (*(uint8_t *)((long)local_d8.data_ + 1) == '?')) {
          bVar13 = ParseState::ParsePerlFlags(&local_a8,&local_d8);
          iVar3 = 1;
          if (bVar13) goto LAB_002398da;
          goto LAB_002398eb;
        }
        if ((local_a8.flags_ >> 0xc & 1) == 0) {
          local_c8.data_ = (const_pointer)0x0;
          local_c8.size_ = 0;
          ParseState::DoLeftParen(&local_a8,&local_c8);
        }
        else {
          ParseState::DoLeftParenNoCapture(&local_a8);
        }
        break;
      case 0x29:
        bVar13 = ParseState::DoRightParen(&local_a8);
        iVar3 = 1;
        if (!bVar13) goto LAB_002398eb;
        break;
      case 0x2a:
        RVar10 = kRegexpStar;
        goto LAB_00239407;
      case 0x2b:
        RVar10 = kRegexpPlus;
LAB_00239407:
        local_c8.data_ = local_d8.data_;
        local_c8.size_ = local_d8.size_;
        puVar9 = (uint8_t *)((long)local_d8.data_ + 1);
        sVar7 = local_d8.size_ - 1;
        if ((local_a8.flags_ & PerlX) == NoParseFlags) {
          bVar13 = false;
          local_d8.data_ = (const_pointer)puVar9;
          local_d8.size_ = sVar7;
LAB_00239471:
          sVar11 = (long)local_d8.data_ - (long)pRVar5;
          local_c8.size_ = sVar11;
          bVar13 = ParseState::PushRepeatOp(&local_a8,RVar10,&local_c8,bVar13);
LAB_00239494:
          if (bVar13 == false) goto LAB_002398a3;
          goto LAB_002398df;
        }
        if ((sVar7 == 0) || (*puVar9 != '?')) {
          bVar13 = false;
          local_d8.data_ = (const_pointer)puVar9;
          local_d8.size_ = sVar7;
        }
        else {
          bVar13 = true;
          local_d8.data_ = (const_pointer)((long)local_d8.data_ + 2);
          local_d8.size_ = local_d8.size_ - 2;
        }
        if (sVar12 == 0) goto LAB_00239471;
LAB_00239452:
        this->code_ = kRegexpRepeatOp;
        (local_70->error_arg_).data_ = (const_pointer)pRVar8;
        (local_70->error_arg_).size_ = (long)local_d8.data_ - (long)pRVar8;
LAB_002398a3:
        iVar3 = 1;
        goto LAB_002398eb;
      case 0x2e:
        ParseState::PushDot(&local_a8);
      }
LAB_002398d1:
      local_d8.data_ = (const_pointer)((long)local_d8.data_ + 1);
      local_d8.size_ = local_d8.size_ - 1;
LAB_002398da:
      sVar11 = 0;
LAB_002398dd:
      pRVar5 = (Regexp *)0x0;
LAB_002398df:
      iVar3 = 0;
      sVar12 = sVar11;
      pRVar8 = pRVar5;
LAB_002398eb:
    } while (iVar3 == 0);
LAB_002399b5:
    pRVar8 = (Regexp *)0x0;
  }
  else {
    if (local_d8.size_ != 0) {
      do {
        iVar3 = StringPieceToRune((Rune *)&local_c8,&local_d8,this);
        if (iVar3 < 0) goto LAB_002399b5;
        ParseState::PushLiteral(&local_a8,(Rune)local_c8.data_);
      } while (local_d8.size_ != 0);
    }
    pRVar8 = ParseState::DoFinish(&local_a8);
  }
LAB_002399c6:
  ParseState::~ParseState(&local_a8);
  RegexpStatus::~RegexpStatus(&local_50);
  return pRVar8;
}

Assistant:

Regexp* Regexp::Parse(const StringPiece& s, ParseFlags global_flags,
                      RegexpStatus* status) {
  // Make status non-NULL (easier on everyone else).
  RegexpStatus xstatus;
  if (status == NULL)
    status = &xstatus;

  ParseState ps(global_flags, s, status);
  StringPiece t = s;

  // Convert regexp to UTF-8 (easier on the rest of the parser).
  if (global_flags & Latin1) {
    std::string* tmp = new std::string;
    ConvertLatin1ToUTF8(t, tmp);
    status->set_tmp(tmp);
    t = *tmp;
  }

  if (global_flags & Literal) {
    // Special parse loop for literal string.
    while (!t.empty()) {
      Rune r;
      if (StringPieceToRune(&r, &t, status) < 0)
        return NULL;
      if (!ps.PushLiteral(r))
        return NULL;
    }
    return ps.DoFinish();
  }

  StringPiece lastunary = StringPiece();
  while (!t.empty()) {
    StringPiece isunary = StringPiece();
    switch (t[0]) {
      default: {
        Rune r;
        if (StringPieceToRune(&r, &t, status) < 0)
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }

      case '(':
        // "(?" introduces Perl escape.
        if ((ps.flags() & PerlX) && (t.size() >= 2 && t[1] == '?')) {
          // Flag changes and non-capturing groups.
          if (!ps.ParsePerlFlags(&t))
            return NULL;
          break;
        }
        if (ps.flags() & NeverCapture) {
          if (!ps.DoLeftParenNoCapture())
            return NULL;
        } else {
          if (!ps.DoLeftParen(StringPiece()))
            return NULL;
        }
        t.remove_prefix(1);  // '('
        break;

      case '|':
        if (!ps.DoVerticalBar())
          return NULL;
        t.remove_prefix(1);  // '|'
        break;

      case ')':
        if (!ps.DoRightParen())
          return NULL;
        t.remove_prefix(1);  // ')'
        break;

      case '^':  // Beginning of line.
        if (!ps.PushCaret())
          return NULL;
        t.remove_prefix(1);  // '^'
        break;

      case '$':  // End of line.
        if (!ps.PushDollar())
          return NULL;
        t.remove_prefix(1);  // '$'
        break;

      case '.':  // Any character (possibly except newline).
        if (!ps.PushDot())
          return NULL;
        t.remove_prefix(1);  // '.'
        break;

      case '[': {  // Character class.
        Regexp* re;
        if (!ps.ParseCharClass(&t, &re, status))
          return NULL;
        if (!ps.PushRegexp(re))
          return NULL;
        break;
      }

      case '*': {  // Zero or more.
        RegexpOp op;
        op = kRegexpStar;
        goto Rep;
      case '+':  // One or more.
        op = kRegexpPlus;
        goto Rep;
      case '?':  // Zero or one.
        op = kRegexpQuest;
        goto Rep;
      Rep:
        StringPiece opstr = t;
        bool nongreedy = false;
        t.remove_prefix(1);  // '*' or '+' or '?'
        if (ps.flags() & PerlX) {
          if (!t.empty() && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (!lastunary.empty()) {
            // In Perl it is not allowed to stack repetition operators:
            //   a** is a syntax error, not a double-star.
            // (and a++ means something else entirely, which we don't support!)
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(StringPiece(
                lastunary.data(),
                static_cast<size_t>(t.data() - lastunary.data())));
            return NULL;
          }
        }
        opstr = StringPiece(opstr.data(),
                            static_cast<size_t>(t.data() - opstr.data()));
        if (!ps.PushRepeatOp(op, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '{': {  // Counted repetition.
        int lo, hi;
        StringPiece opstr = t;
        if (!MaybeParseRepetition(&t, &lo, &hi)) {
          // Treat like a literal.
          if (!ps.PushLiteral('{'))
            return NULL;
          t.remove_prefix(1);  // '{'
          break;
        }
        bool nongreedy = false;
        if (ps.flags() & PerlX) {
          if (!t.empty() && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (!lastunary.empty()) {
            // Not allowed to stack repetition operators.
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(StringPiece(
                lastunary.data(),
                static_cast<size_t>(t.data() - lastunary.data())));
            return NULL;
          }
        }
        opstr = StringPiece(opstr.data(),
                            static_cast<size_t>(t.data() - opstr.data()));
        if (!ps.PushRepetition(lo, hi, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '\\': {  // Escaped character or Perl sequence.
        // \b and \B: word boundary or not
        if ((ps.flags() & Regexp::PerlB) &&
            t.size() >= 2 && (t[1] == 'b' || t[1] == 'B')) {
          if (!ps.PushWordBoundary(t[1] == 'b'))
            return NULL;
          t.remove_prefix(2);  // '\\', 'b'
          break;
        }

        if ((ps.flags() & Regexp::PerlX) && t.size() >= 2) {
          if (t[1] == 'A') {
            if (!ps.PushSimpleOp(kRegexpBeginText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'A'
            break;
          }
          if (t[1] == 'z') {
            if (!ps.PushSimpleOp(kRegexpEndText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'z'
            break;
          }
          // Do not recognize \Z, because this library can't
          // implement the exact Perl/PCRE semantics.
          // (This library treats "(?-m)$" as \z, even though
          // in Perl and PCRE it is equivalent to \Z.)

          if (t[1] == 'C') {  // \C: any byte [sic]
            if (!ps.PushSimpleOp(kRegexpAnyByte))
              return NULL;
            t.remove_prefix(2);  // '\\', 'C'
            break;
          }

          if (t[1] == 'Q') {  // \Q ... \E: the ... is always literals
            t.remove_prefix(2);  // '\\', 'Q'
            while (!t.empty()) {
              if (t.size() >= 2 && t[0] == '\\' && t[1] == 'E') {
                t.remove_prefix(2);  // '\\', 'E'
                break;
              }
              Rune r;
              if (StringPieceToRune(&r, &t, status) < 0)
                return NULL;
              if (!ps.PushLiteral(r))
                return NULL;
            }
            break;
          }
        }

        if (t.size() >= 2 && (t[1] == 'p' || t[1] == 'P')) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          switch (ParseUnicodeGroup(&t, ps.flags(), re->ccb_, status)) {
            case kParseOk:
              if (!ps.PushRegexp(re))
                return NULL;
              goto Break2;
            case kParseError:
              re->Decref();
              return NULL;
            case kParseNothing:
              re->Decref();
              break;
          }
        }

        const UGroup *g = MaybeParsePerlCCEscape(&t, ps.flags());
        if (g != NULL) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          AddUGroup(re->ccb_, g, g->sign, ps.flags());
          if (!ps.PushRegexp(re))
            return NULL;
          break;
        }

        Rune r;
        if (!ParseEscape(&t, &r, status, ps.rune_max()))
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }
    }
  Break2:
    lastunary = isunary;
  }
  return ps.DoFinish();
}